

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Lazy<cinatra::resp_data> chunked_upload1(coro_http_client *client)

{
  element_type *peVar1;
  size_t in_RSI;
  
  peVar1 = (element_type *)operator_new(0x3c8,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (client->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         chunked_upload1;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)chunked_upload1;
    ((string_view *)((long)(peVar1->parser_).headers_._M_elems + 0x370))->_M_len = in_RSI;
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x18) = 0;
    (client->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x378) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)client;
}

Assistant:

async_simple::coro::Lazy<resp_data> chunked_upload1(coro_http_client &client) {
  std::string filename = "test.txt";
  create_file(filename, 1010);

  coro_io::coro_file file{};
  file.open(filename, std::ios::in);

  std::string buf;
  cinatra::detail::resize(buf, 100);

  auto fn = [&file, &buf]() -> async_simple::coro::Lazy<read_result> {
    auto [ec, size] = co_await file.async_read(buf.data(), buf.size());
    co_return read_result{{buf.data(), buf.size()}, file.eof(), ec};
  };

  auto result = co_await client.async_upload_chunked(
      "http://127.0.0.1:9001/chunked"sv, http_method::POST, std::move(fn));
  co_return result;
}